

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O1

void BrotliCompressFragmentTwoPassImpl15
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t input_size_00;
  uint32_t *puVar4;
  byte bVar5;
  undefined4 in_register_0000000c;
  size_t *commands;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint32_t *input_00;
  uint32_t *__src;
  uint32_t *puVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint32_t *puVar13;
  ulong uVar14;
  uint32_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  size_t *unaff_R15;
  bool bVar21;
  uint32_t *local_a0;
  size_t *local_98;
  ulong local_90;
  long local_88;
  
  commands = (size_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (uint32_t *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      puVar4 = (uint32_t *)(input_size_00 + (long)input_00);
      __src = input_00;
      local_98 = commands;
      local_a0 = command_buf;
      if (0xf < input_size) {
        uVar16 = input_size - 0x10;
        if (input_size_00 - 4 < input_size - 0x10) {
          uVar16 = input_size_00 - 4;
        }
        puVar13 = (uint32_t *)(uVar16 + (long)input_00);
        puVar15 = (uint32_t *)((long)input_00 + 1);
        uVar16 = (ulong)(*(long *)((long)input_00 + 1) * 0x1e35a7bd00000000) >> 0x31;
        local_88 = 0xffffffff;
LAB_0012231a:
        uVar6 = 0x20;
        do {
          puVar9 = (uint32_t *)((ulong)(uVar6 >> 5) + (long)puVar15);
          iVar18 = (int)input;
          iVar12 = (int)puVar15;
          if (puVar13 < puVar9) {
            iVar3 = 7;
          }
          else {
            uVar17 = (ulong)(*(long *)puVar9 * 0x1e35a7bd00000000) >> 0x31;
            if ((*puVar15 == *(uint32_t *)((long)puVar15 + -(long)(int)local_88)) &&
               (0 < (int)local_88)) {
              unaff_R15 = (size_t *)(-(long)(int)local_88 + (long)puVar15);
              *(int *)(literal_buf + uVar16 * 4) = iVar12 - iVar18;
              iVar3 = 5;
              uVar16 = uVar17;
            }
            else {
              unaff_R15 = (size_t *)(input + *(int *)(literal_buf + uVar16 * 4));
              *(int *)(literal_buf + uVar16 * 4) = iVar12 - iVar18;
              iVar3 = 0;
              uVar16 = uVar17;
            }
          }
          if (iVar3 == 5) {
LAB_00122394:
            lVar19 = (long)puVar15 - (long)unaff_R15;
            if (lVar19 < 0x3fff1) goto LAB_001223b7;
          }
          else {
            if (iVar3 != 0) goto LAB_001228b5;
            if (*puVar15 == (uint32_t)*unaff_R15) goto LAB_00122394;
          }
          uVar6 = uVar6 + 1;
          puVar15 = puVar9;
        } while( true );
      }
LAB_00122901:
      if (__src < puVar4) {
        uVar6 = (uint)((long)puVar4 - (long)__src);
        if (5 < uVar6) {
          if (uVar6 < 0x82) {
            uVar6 = uVar6 - 2;
            uVar1 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
              }
            }
            bVar5 = (char)(uVar1 ^ 0xffffffe0) + 0x1f;
            uVar2 = uVar6 >> (bVar5 & 0x1f);
            uVar6 = (uVar6 - (uVar2 << (bVar5 & 0x1f))) * 0x100 |
                    uVar2 + (uVar1 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar6 < 0x842) {
            uVar1 = 0x1f;
            if (uVar6 - 0x42 != 0) {
              for (; uVar6 - 0x42 >> uVar1 == 0; uVar1 = uVar1 - 1) {
              }
            }
            uVar6 = (((-1 << ((byte)uVar1 & 0x1f)) + uVar6 + -0x42) * 0x100 - (uVar1 ^ 0x1f)) + 0x29
            ;
          }
          else {
            iVar12 = uVar6 * 0x100;
            if (uVar6 < 0x1842) {
              uVar6 = iVar12 - 0x841eb;
            }
            else if (uVar6 < 0x5842) {
              uVar6 = iVar12 - 0x1841ea;
            }
            else {
              uVar6 = iVar12 - 0x5841e9;
            }
          }
        }
        *(uint *)local_98 = uVar6;
        local_98 = (size_t *)((long)local_98 + 4);
        uVar16 = (long)puVar4 - (long)__src & 0xffffffff;
        memcpy(local_a0,__src,uVar16);
        local_a0 = (uint32_t *)((long)local_a0 + uVar16);
      }
      iVar12 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_a0 - (long)command_buf);
      if (iVar12 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar12 = *table;
        *(ulong *)table = (ulong)(iVar12 + 7U & 0xfffffff8);
        memcpy((void *)((ulong)(iVar12 + 7U >> 3) + (long)storage_ix),input_00,input_size_00);
        uVar16 = input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar16;
        *(undefined1 *)((long)storage_ix + (uVar16 >> 3)) = 0;
        unaff_R15 = storage_ix;
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar16 = *(ulong *)table;
        uVar17 = uVar16 >> 3;
        *(ulong *)((long)storage_ix + uVar17) = (ulong)*(byte *)((long)storage_ix + uVar17);
        *(ulong *)table = uVar16 + 0xd;
        StoreCommands(m,(uint8_t *)command_buf,(long)local_a0 - (long)command_buf,
                      (uint32_t *)commands,(long)local_98 - (long)commands >> 2,(size_t *)table,
                      (uint8_t *)storage_ix);
        unaff_R15 = commands;
      }
      input_size = input_size - input_size_00;
      input_00 = puVar4;
    } while (input_size != 0);
  }
  return;
LAB_001223b7:
  uVar17 = (long)puVar4 + (-4 - (long)puVar15);
  if (7 < uVar17) {
    uVar7 = uVar17 & 0xfffffffffffffff8;
    puVar9 = (uint32_t *)((long)puVar15 + uVar7 + 4);
    lVar8 = 0;
    uVar14 = 0;
LAB_001223f4:
    uVar10 = *(ulong *)(puVar15 + 1 + uVar14 * 2);
    uVar20 = *(ulong *)((long)unaff_R15 + uVar14 * 8 + 4);
    if (uVar10 == uVar20) goto code_r0x00122402;
    uVar20 = uVar20 ^ uVar10;
    uVar17 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    local_90 = (uVar17 >> 3 & 0x1fffffff) - lVar8;
    goto LAB_00122435;
  }
  uVar7 = 0;
  puVar9 = puVar15 + 1;
LAB_001228c2:
  uVar17 = uVar17 & 7;
  local_90 = uVar7;
  if (uVar17 != 0) {
    uVar14 = uVar7 | uVar17;
    do {
      local_90 = uVar7;
      if (*(char *)((long)unaff_R15 + uVar7 + 4) != (char)*puVar9) break;
      puVar9 = (uint32_t *)((long)puVar9 + 1);
      uVar7 = uVar7 + 1;
      uVar17 = uVar17 - 1;
      local_90 = uVar14;
    } while (uVar17 != 0);
  }
LAB_00122435:
  uVar1 = iVar12 - (int)__src;
  uVar6 = uVar1;
  if (5 < uVar1) {
    if (uVar1 < 0x82) {
      uVar2 = uVar1 - 2;
      uVar6 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      bVar5 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
      uVar11 = uVar2 >> (bVar5 & 0x1f);
      uVar6 = (uVar2 - (uVar11 << (bVar5 & 0x1f))) * 0x100 |
              uVar11 + (uVar6 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar1 < 0x842) {
      uVar6 = 0x1f;
      if (uVar1 - 0x42 != 0) {
        for (; uVar1 - 0x42 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (((-1 << ((byte)uVar6 & 0x1f)) + uVar1 + -0x42) * 0x100 - (uVar6 ^ 0x1f)) + 0x29;
    }
    else {
      iVar12 = uVar1 * 0x100;
      if (uVar1 < 0x1842) {
        uVar6 = iVar12 - 0x841eb;
      }
      else if (uVar1 < 0x5842) {
        uVar6 = iVar12 - 0x1841ea;
      }
      else {
        uVar6 = iVar12 - 0x5841e9;
      }
    }
  }
  *(uint *)local_98 = uVar6;
  memcpy(local_a0,__src,(long)(int)uVar1);
  uVar6 = 0x40;
  bVar21 = (int)local_88 != (int)lVar19;
  if (bVar21) {
    uVar2 = (int)lVar19 + 3;
    uVar6 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    bVar5 = 0x1e - (char)(uVar6 ^ 0x1f);
    bVar21 = (uVar2 >> (bVar5 & 0x1f) & 1) != 0;
    uVar6 = (uint)bVar21 +
            ((uVar2 - (bVar21 + 2 << (bVar5 & 0x1f))) * 0x100 | (uVar6 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    local_88 = lVar19;
  }
  uVar17 = local_90 + 4;
  *(uint *)((long)local_98 + 4) = uVar6;
  if (uVar17 < 0xc) {
    uVar6 = (int)uVar17 + 0x14;
  }
  else {
    if (0x47 < uVar17) {
      if (uVar17 < 0x88) {
        uVar6 = ((uint)(local_90 - 4) & 0x1f) << 8 | (int)(local_90 - 4 >> 5) + 0x36U;
LAB_001225d1:
        *(uint *)(local_98 + 1) = uVar6;
      }
      else {
        if (0x847 < uVar17) {
          uVar6 = (int)uVar17 * 0x100 - 0x847c1;
          goto LAB_001225d1;
        }
        uVar6 = (int)local_90 - 0x44;
        iVar12 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        *(uint *)(local_98 + 1) =
             ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)local_90 + -0x44) * 0x100 + iVar12 + 0x34;
      }
      *(uint *)((long)local_98 + 0xc) = 0x40;
      lVar19 = 0x10;
      goto LAB_001225e2;
    }
    uVar6 = 0x1f;
    uVar2 = (uint)(local_90 - 4);
    if (uVar2 != 0) {
      for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    bVar5 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
    uVar17 = local_90 - 4 >> (bVar5 & 0x3f);
    uVar6 = (uVar2 - (int)(uVar17 << (bVar5 & 0x3f))) * 0x100 |
            (int)uVar17 + (uVar6 ^ 0xffffffe0) * 2 + 0x5a;
  }
  *(uint *)(local_98 + 1) = uVar6;
  lVar19 = 0xc;
LAB_001225e2:
  __src = (uint32_t *)((long)puVar15 + local_90 + 4);
  if (__src < puVar13) {
    uVar17 = *(ulong *)((long)puVar15 + local_90 + 1);
    uVar7 = (uVar17 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x31;
    uVar14 = uVar17 * 0x1e35a7bd00000000 >> 0x31;
    iVar12 = (int)__src - iVar18;
    *(int *)(literal_buf + uVar14 * 4) = iVar12 + -3;
    *(int *)(literal_buf + ((uVar17 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x31) * 4) = iVar12 + -2;
    *(int *)(literal_buf + uVar14 * 4) = iVar12 + -1;
    unaff_R15 = (size_t *)(input + *(int *)(literal_buf + uVar7 * 4));
    *(int *)(literal_buf + uVar7 * 4) = iVar12;
    iVar3 = 0;
  }
  else {
    iVar3 = 7;
  }
  local_a0 = (uint32_t *)((long)local_a0 + (long)(int)uVar1);
  local_98 = (size_t *)((long)local_98 + lVar19);
  while (puVar15 = __src, __src < puVar13) {
    lVar19 = (long)__src - (long)unaff_R15;
    if ((0x3fff0 < lVar19) || (*__src != (uint32_t)*unaff_R15)) {
      uVar16 = (ulong)(*(long *)((long)__src + 1) * 0x1e35a7bd00000000) >> 0x31;
      iVar3 = 0;
      puVar15 = (uint32_t *)((long)__src + 1);
      break;
    }
    uVar17 = (long)puVar4 + (-4 - (long)__src);
    if (7 < uVar17) {
      uVar7 = uVar17 & 0xfffffffffffffff8;
      puVar15 = (uint32_t *)((long)__src + uVar7 + 4);
      lVar8 = 0;
      uVar14 = 0;
LAB_001226ce:
      uVar10 = *(ulong *)(__src + 1 + uVar14 * 2);
      uVar20 = *(ulong *)((long)unaff_R15 + uVar14 * 8 + 4);
      if (uVar10 == uVar20) goto code_r0x001226dc;
      uVar20 = uVar20 ^ uVar10;
      uVar17 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      uVar14 = (uVar17 >> 3 & 0x1fffffff) - lVar8;
      goto LAB_00122721;
    }
    uVar7 = 0;
    puVar15 = __src + 1;
LAB_00122866:
    uVar17 = uVar17 & 7;
    uVar14 = uVar7;
    if (uVar17 != 0) {
      uVar10 = uVar7 | uVar17;
      do {
        uVar14 = uVar7;
        if (*(char *)((long)unaff_R15 + uVar7 + 4) != (char)*puVar15) break;
        puVar15 = (uint32_t *)((long)puVar15 + 1);
        uVar7 = uVar7 + 1;
        uVar17 = uVar17 - 1;
        uVar14 = uVar10;
      } while (uVar17 != 0);
    }
LAB_00122721:
    uVar17 = uVar14 + 4;
    if (uVar17 < 10) {
      uVar6 = (int)uVar17 + 0x26;
    }
    else if (uVar17 < 0x86) {
      uVar6 = 0x1f;
      uVar1 = (uint)(uVar14 - 2);
      if (uVar1 != 0) {
        for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      bVar5 = (char)(uVar6 ^ 0xffffffe0) + 0x1f;
      uVar17 = uVar14 - 2 >> (bVar5 & 0x3f);
      uVar6 = (uVar1 - (int)(uVar17 << (bVar5 & 0x3f))) * 0x100 |
              (int)uVar17 + (uVar6 ^ 0xffffffe0) * 2 + 0x6a;
    }
    else if (uVar17 < 0x846) {
      uVar6 = (int)uVar14 - 0x42;
      iVar12 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      uVar6 = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)uVar14 + -0x42) * 0x100 + iVar12 + 0x34;
    }
    else {
      uVar6 = (int)uVar17 * 0x100 - 0x845c1;
    }
    puVar15 = (uint32_t *)((long)__src + uVar14 + 4);
    *(uint *)local_98 = uVar6;
    uVar1 = (int)lVar19 + 3;
    uVar6 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    bVar5 = 0x1e - (char)(uVar6 ^ 0x1f);
    bVar21 = (uVar1 >> (bVar5 & 0x1f) & 1) != 0;
    *(uint *)((long)local_98 + 4) =
         ((uVar1 - (bVar21 + 2 << (bVar5 & 0x1f))) * 0x100 | (uVar6 ^ 0x1f) * 2 ^ 0x3e) +
         (uint)bVar21 + 0x4c;
    if (puVar15 < puVar13) {
      uVar17 = *(ulong *)((long)__src + uVar14 + 1);
      uVar7 = (uVar17 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x31;
      iVar12 = (int)puVar15 - iVar18;
      *(int *)(literal_buf + (uVar17 * 0x1e35a7bd00000000 >> 0x31) * 4) = iVar12 + -3;
      *(int *)(literal_buf + ((uVar17 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x31) * 4) = iVar12 + -2
      ;
      *(int *)(literal_buf + ((uVar17 & 0xffffffff0000) * 0x1e35a7bd0000 >> 0x31) * 4) = iVar12 + -1
      ;
      unaff_R15 = (size_t *)(input + *(int *)(literal_buf + uVar7 * 4));
      *(int *)(literal_buf + uVar7 * 4) = iVar12;
      iVar3 = 0;
    }
    else {
      iVar3 = 7;
    }
    local_98 = local_98 + 1;
    __src = puVar15;
    local_88 = lVar19;
  }
LAB_001228b5:
  if (iVar3 != 0) goto LAB_00122901;
  goto LAB_0012231a;
code_r0x00122402:
  uVar14 = uVar14 + 1;
  lVar8 = lVar8 + -8;
  if (uVar17 >> 3 == uVar14) goto LAB_001228c2;
  goto LAB_001223f4;
code_r0x001226dc:
  uVar14 = uVar14 + 1;
  lVar8 = lVar8 + -8;
  if (uVar17 >> 3 == uVar14) goto LAB_00122866;
  goto LAB_001226ce;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}